

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soap_ctrlpt.c
# Opt level: O0

int get_response_value(http_message_t *hmsg,int code,char *name,int *upnp_error_code,
                      IXML_Node **action_value,char **str_value)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char *nodeValue;
  char *names [5];
  int local_74;
  int done;
  int err_code;
  char *error_node_str;
  char *temp_str;
  char *node_str;
  IXML_Document *doc;
  IXML_Node *error_node;
  IXML_Node *root_node;
  IXML_Node *node;
  char **str_value_local;
  IXML_Node **action_value_local;
  int *upnp_error_code_local;
  char *name_local;
  http_message_t *phStack_10;
  int code_local;
  http_message_t *hmsg_local;
  
  root_node = (IXML_Node *)0x0;
  error_node = (IXML_Node *)0x0;
  doc = (IXML_Document *)0x0;
  node_str = (char *)0x0;
  temp_str = (char *)0x0;
  _done = (char *)0x0;
  local_74 = -0x71;
  bVar1 = false;
  node = (IXML_Node *)str_value;
  str_value_local = (char **)action_value;
  action_value_local = (IXML_Node **)upnp_error_code;
  upnp_error_code_local = (int *)name;
  name_local._4_4_ = code;
  phStack_10 = hmsg;
  if ((((hmsg->status_code != 200) && (hmsg->status_code != 500)) ||
      (iVar2 = has_xml_content_type(hmsg), iVar2 == 0)) ||
     ((iVar2 = ixmlParseBufferEx((phStack_10->entity).buf,(IXML_Document **)&node_str), iVar2 != 0
      || (error_node = ixmlNode_getFirstChild((IXML_Node *)node_str), error_node == (IXML_Node *)0x0
         )))) goto LAB_001274d2;
  if (name_local._4_4_ == 1) {
    if (str_value_local == (char **)0x0) {
      __assert_fail("action_value != NULL",".upnp/src/soap/soap_ctrlpt.c",0x18c,
                    "int get_response_value(http_message_t *, int, char *, int *, IXML_Node **, char **)"
                   );
    }
    *str_value_local = (char *)0x0;
    nodeValue = "Envelope";
    names[0] = "Body";
    names[1] = (char *)upnp_error_code_local;
    iVar2 = dom_find_deep_node(&nodeValue,3,error_node,&root_node);
    if (iVar2 == 0) {
      temp_str = ixmlPrintNode(root_node);
      if (temp_str == (char *)0x0) {
        local_74 = -0x68;
        goto LAB_001274d2;
      }
      iVar2 = ixmlParseBufferEx(temp_str,(IXML_Document **)str_value_local);
      if (iVar2 != 0) {
        local_74 = -0x71;
        goto LAB_001274d2;
      }
      local_74 = 1;
      bVar1 = true;
    }
  }
  else if (name_local._4_4_ == 2) {
    if (node == (IXML_Node *)0x0) {
      __assert_fail("str_value != NULL",".upnp/src/soap/soap_ctrlpt.c",0x1a4,
                    "int get_response_value(http_message_t *, int, char *, int *, IXML_Node **, char **)"
                   );
    }
    node->nodeName = (char *)0x0;
    nodeValue = "Envelope";
    names[0] = "Body";
    names[1] = "QueryStateVariableResponse";
    names[2] = "return";
    iVar2 = dom_find_deep_node(&nodeValue,4,error_node,&root_node);
    if (iVar2 == 0) {
      pcVar3 = get_node_value(root_node);
      if (pcVar3 == (char *)0x0) goto LAB_001274d2;
      pcVar3 = ixmlCloneDOMString(pcVar3);
      node->nodeName = pcVar3;
      local_74 = 2;
      bVar1 = true;
    }
  }
  if (!bVar1) {
    node->nodeName = (char *)0x0;
    nodeValue = "Envelope";
    names[0] = "Body";
    names[1] = "Fault";
    names[2] = "detail";
    names[3] = "UPnPError";
    iVar2 = dom_find_deep_node(&nodeValue,5,error_node,(IXML_Node **)&doc);
    if (((iVar2 == 0) && (iVar2 = dom_find_node("errorCode",&doc->n,&root_node), iVar2 == 0)) &&
       (pcVar3 = get_node_value(root_node), pcVar3 != (char *)0x0)) {
      iVar2 = atoi(pcVar3);
      *(int *)action_value_local = iVar2;
      if (*(int *)action_value_local < 0x191) {
        if (name_local._4_4_ == 2) {
          iVar2 = dom_find_node("errorDescription",&doc->n,&root_node);
          if ((iVar2 == 0) && (pcVar3 = get_node_value(root_node), pcVar3 != (char *)0x0)) {
            pcVar3 = ixmlCloneDOMString(pcVar3);
            node->nodeName = pcVar3;
            if (node->nodeName != (char *)0x0) {
              local_74 = 4;
            }
          }
        }
        else if (name_local._4_4_ == 1) {
          _done = ixmlPrintNode(&doc->n);
          if (_done == (char *)0x0) {
            local_74 = -0x68;
          }
          else {
            iVar2 = ixmlParseBufferEx(_done,(IXML_Document **)str_value_local);
            if (iVar2 == 0) {
              local_74 = 3;
            }
            else {
              local_74 = -0x71;
            }
          }
        }
      }
      else {
        local_74 = *(int *)action_value_local;
      }
    }
  }
LAB_001274d2:
  ixmlDocument_free((IXML_Document *)node_str);
  ixmlFreeDOMString(temp_str);
  ixmlFreeDOMString(_done);
  return local_74;
}

Assistant:

static int get_response_value(http_message_t *hmsg,
	int code,
	char *name,
	int *upnp_error_code,
	IXML_Node **action_value,
	DOMString *str_value)
{
	IXML_Node *node = NULL;
	IXML_Node *root_node = NULL;
	IXML_Node *error_node = NULL;
	IXML_Document *doc = NULL;
	char *node_str = NULL;
	const char *temp_str = NULL;
	DOMString error_node_str = NULL;
	int err_code = UPNP_E_BAD_RESPONSE; /* default error */
	int done = 0;
	const char *names[5];
	const DOMString nodeValue;

	/* only 200 and 500 status codes are relevant */
	if ((hmsg->status_code != HTTP_OK &&
		    hmsg->status_code != HTTP_INTERNAL_SERVER_ERROR) ||
		!has_xml_content_type(hmsg))
		goto error_handler;
	if (ixmlParseBufferEx(hmsg->entity.buf, &doc) != IXML_SUCCESS)
		goto error_handler;
	root_node = ixmlNode_getFirstChild((IXML_Node *)doc);
	if (root_node == NULL)
		goto error_handler;
	if (code == SOAP_ACTION_RESP) {
		/* try reading soap action response */
		assert(action_value != NULL);

		*action_value = NULL;
		names[0] = "Envelope";
		names[1] = "Body";
		names[2] = name;
		if (dom_find_deep_node(names, 3, root_node, &node) ==
			UPNP_E_SUCCESS) {
			node_str = ixmlPrintNode(node);
			if (node_str == NULL) {
				err_code = UPNP_E_OUTOF_MEMORY;
				goto error_handler;
			}
			if (ixmlParseBufferEx(
				    node_str, (IXML_Document **)action_value) !=
				IXML_SUCCESS) {
				err_code = UPNP_E_BAD_RESPONSE;
				goto error_handler;
			}
			err_code = SOAP_ACTION_RESP;
			done = 1;
		}
	} else if (code == SOAP_VAR_RESP) {
		/* try reading var response */
		assert(str_value != NULL);

		*str_value = NULL;
		names[0] = "Envelope";
		names[1] = "Body";
		names[2] = "QueryStateVariableResponse";
		names[3] = "return";
		if (dom_find_deep_node(names, 4, root_node, &node) ==
			UPNP_E_SUCCESS) {
			nodeValue = get_node_value(node);
			if (nodeValue == NULL)
				goto error_handler;
			*str_value = ixmlCloneDOMString(nodeValue);
			err_code = SOAP_VAR_RESP;
			done = 1;
		}
	}
	if (!done) {
		/* not action or var resp; read error code and description */
		*str_value = NULL;
		names[0] = "Envelope";
		names[1] = "Body";
		names[2] = "Fault";
		names[3] = "detail";
		names[4] = "UPnPError";
		if (dom_find_deep_node(names, 5, root_node, &error_node) !=
			UPNP_E_SUCCESS)
			goto error_handler;
		if (dom_find_node("errorCode", error_node, &node) !=
			UPNP_E_SUCCESS)
			goto error_handler;
		temp_str = get_node_value(node);
		if (!temp_str)
			goto error_handler;
		*upnp_error_code = atoi(temp_str);
		if (*upnp_error_code > 400) {
			err_code = *upnp_error_code;
			goto error_handler; /* bad SOAP error code */
		}
		if (code == SOAP_VAR_RESP) {
			if (dom_find_node("errorDescription",
				    error_node,
				    &node) != UPNP_E_SUCCESS) {
				goto error_handler;
			}
			nodeValue = get_node_value(node);
			if (nodeValue == NULL) {
				goto error_handler;
			}
			*str_value = ixmlCloneDOMString(nodeValue);
			if (*str_value == NULL) {
				goto error_handler;
			}
			err_code = SOAP_VAR_RESP_ERROR;
		} else if (code == SOAP_ACTION_RESP) {
			error_node_str = ixmlPrintNode(error_node);
			if (error_node_str == NULL) {
				err_code = UPNP_E_OUTOF_MEMORY;
				goto error_handler;
			}
			if (ixmlParseBufferEx(error_node_str,
				    (IXML_Document **)action_value) !=
				IXML_SUCCESS) {
				err_code = UPNP_E_BAD_RESPONSE;

				goto error_handler;
			}
			err_code = SOAP_ACTION_RESP_ERROR;
		}
	}

error_handler:
	ixmlDocument_free(doc);
	ixmlFreeDOMString(node_str);
	ixmlFreeDOMString(error_node_str);
	return err_code;
}